

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O3

void __thiscall
GslSpan_FromContainerConstructor_Test::TestBody(GslSpan_FromContainerConstructor_Test *this)

{
  pointer piVar1;
  char *pcVar2;
  initializer_list<int> __l;
  span<const_int,__1L> cs;
  span<int,__1L> s;
  vector<int,_std::allocator<int>_> v;
  vector<int,_std::allocator<int>_> cv;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  AssertHelper local_80;
  extent_type<_1L> local_78;
  AssertHelperData *local_70;
  extent_type<_1L> local_68;
  AssertHelperData *local_60;
  AssertHelper local_58;
  vector<int,_std::allocator<int>_> local_50;
  vector<int,_std::allocator<int>_> local_38;
  extent_type<_1L> local_20;
  undefined8 local_18;
  
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_200000001;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 3;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l,(allocator_type *)&local_68);
  std::vector<int,_std::allocator<int>_>::vector(&local_38,&local_50);
  piVar1 = local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pstore::gsl::details::extent_type<-1L>::extent_type
            (&local_68,
             (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  local_60 = (AssertHelperData *)piVar1;
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CONCAT71(local_68.size_._1_7_,local_68.size_._0_1_);
  local_80.data_ =
       (AssertHelperData *)
       ((long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start >> 2);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_78,"s.size ()","static_cast<std::ptrdiff_t> (v.size ())",
             (long *)&local_90,(long *)&local_80);
  if (local_78.size_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_70 == (AssertHelperData *)0x0) {
      pcVar2 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar2 = ((_Alloc_hider *)&local_70->type)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x266,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_70 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  }
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
  local_80.data_ =
       (AssertHelperData *)
       local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  testing::internal::CmpHelperEQ<int*,int*>
            ((internal *)&local_78,"s.data ()","v.data ()",(int **)&local_90,(int **)&local_80);
  if (local_78.size_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_70 == (AssertHelperData *)0x0) {
      pcVar2 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar2 = ((_Alloc_hider *)&local_70->type)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x267,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_70 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  }
  piVar1 = local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pstore::gsl::details::extent_type<-1L>::extent_type
            (&local_78,
             (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  local_70 = (AssertHelperData *)piVar1;
  local_80.data_ = (AssertHelperData *)local_78.size_;
  local_58.data_ =
       (AssertHelperData *)
       ((long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start >> 2);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_90,"cs.size ()","static_cast<std::ptrdiff_t> (v.size ())",
             (long *)&local_80,(long *)&local_58);
  if (local_90._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar2 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x26a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_80.data_ + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  local_80.data_ = local_70;
  local_58.data_ =
       (AssertHelperData *)
       local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  testing::internal::CmpHelperEQ<int_const*,int*>
            ((internal *)&local_90,"cs.data ()","v.data ()",(int **)&local_80,(int **)&local_58);
  if (local_90._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar2 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x26b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_80.data_ + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  pstore::gsl::details::extent_type<-1L>::extent_type(&local_20,0);
  piVar1 = local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_18 = 0;
  pstore::gsl::details::extent_type<-1L>::extent_type
            (&local_68,
             (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  local_78.size_ = CONCAT71(local_68.size_._1_7_,local_68.size_._0_1_);
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start >> 2);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_68,"s.size ()","static_cast<std::ptrdiff_t> (v.size ())",
             &local_78.size_,(long *)&local_90);
  if (local_68.size_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_60 == (AssertHelperData *)0x0) {
      pcVar2 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar2 = ((_Alloc_hider *)&local_60->type)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2b2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((long *)local_78.size_ != (long *)0x0) {
      (**(code **)(*(long *)local_78.size_ + 8))();
    }
  }
  if (local_60 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  }
  local_78.size_ = (index_type)piVar1;
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  testing::internal::CmpHelperEQ<int*,int*>
            ((internal *)&local_68,"s.data ()","v.data ()",(int **)&local_78,(int **)&local_90);
  if (local_68.size_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_60 == (AssertHelperData *)0x0) {
      pcVar2 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar2 = ((_Alloc_hider *)&local_60->type)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2b3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((AssertHelperData *)local_78.size_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_78.size_ + 8))();
    }
  }
  if (local_60 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  }
  piVar1 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pstore::gsl::details::extent_type<-1L>::extent_type
            (&local_68,
             CONCAT44(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_) -
             (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  local_78.size_ = CONCAT71(local_68.size_._1_7_,local_68.size_._0_1_);
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT44(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_,
                 local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_4_) -
        (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start >> 2);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_68,"cs.size ()","static_cast<std::ptrdiff_t> (cv.size ())",
             &local_78.size_,(long *)&local_90);
  if (local_68.size_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_60 == (AssertHelperData *)0x0) {
      pcVar2 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar2 = ((_Alloc_hider *)&local_60->type)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2b6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((long *)local_78.size_ != (long *)0x0) {
      (**(code **)(*(long *)local_78.size_ + 8))();
    }
  }
  if (local_60 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  }
  local_78.size_ = (index_type)piVar1;
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  testing::internal::CmpHelperEQ<int_const*,int_const*>
            ((internal *)&local_68,"cs.data ()","cv.data ()",(int **)&local_78,(int **)&local_90);
  if (local_68.size_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_60 == (AssertHelperData *)0x0) {
      pcVar2 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar2 = ((_Alloc_hider *)&local_60->type)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2b7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.size_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78.size_ + 8))();
    }
  }
  if (local_60 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((AssertHelperData *)
      local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (AssertHelperData *)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST (GslSpan, FromContainerConstructor) {
    std::vector<int> v = {1, 2, 3};
    std::vector<int> const cv = v;

    {
        span<int> s{v};
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (v.size ()));
        EXPECT_EQ (s.data (), v.data ());

        span<const int> cs{v};
        EXPECT_EQ (cs.size (), static_cast<std::ptrdiff_t> (v.size ()));
        EXPECT_EQ (cs.data (), v.data ());
    }

#if 0
    std::string str = "hello";
    std::string const cstr = "hello";

    {
#    ifdef CONFIRM_COMPILATION_ERRORS
        span<char> s{str};
        EXPECT_EQ (s.size() == narrow_cast<std::ptrdiff_t>(str.size()) && s.data(), str.data());
#    endif
        span<char const > cs{str};
        EXPECT_EQ (cs.size(), static_cast<std::ptrdiff_t>(str.size()));
        EXPECT_EQ (cs.data(), str.data());
    }
    {
#    ifdef CONFIRM_COMPILATION_ERRORS
        span<char> s{cstr};
#    endif
        span<const char> cs{cstr};
        EXPECT_EQ (cs.size(), static_cast<std::ptrdiff_t>(cstr.size()));
        EXPECT_EQ (cs.data(), cstr.data());
    }
#endif
    {
#ifdef CONFIRM_COMPILATION_ERRORS
        auto get_temp_vector = [] () -> std::vector<int> { return {}; };
        auto use_span = [] (span<int> s) { static_cast<void> (s); };
        use_span (get_temp_vector ());
#endif
    }
    {
        auto get_temp_vector = [] () -> std::vector<int> { return {}; };
        auto use_span = [] (span<int const> s) { static_cast<void> (s); };
        use_span (span<int const> (get_temp_vector ()));
    }
    {
#ifdef CONFIRM_COMPILATION_ERRORS
        auto get_temp_string = [] () -> std::string { return {}; };
        auto use_span = [] (span<char> s) { static_cast<void> (s); };
        use_span (get_temp_string ());
#endif
    }
#if 0
    {
        auto get_temp_string = []() -> std::string { return {}; };
        auto use_span = [](span<char const> s) { static_cast<void>(s); };
        use_span(get_temp_string());
    }
    {
#    ifdef CONFIRM_COMPILATION_ERRORS
        auto get_temp_vector = []() -> const std::vector<int> { return {}; };
        auto use_span = [](span<const char> s) { static_cast<void>(s); };
        use_span(get_temp_vector());
#    endif
    }
    {
        auto get_temp_string = []() -> std::string const { return {}; };
        auto use_span = [](span<char const> s) { static_cast<void>(s); };
        use_span(get_temp_string());
    }
#endif
    {
#ifdef CONFIRM_COMPILATION_ERRORS
        std::map<int, int> m;
        span<int> s{m};
#endif
    }
    {
        auto s = make_span (v);
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (v.size ()));
        EXPECT_EQ (s.data (), v.data ());

        auto cs = make_span (cv);
        EXPECT_EQ (cs.size (), static_cast<std::ptrdiff_t> (cv.size ()));
        EXPECT_EQ (cs.data (), cv.data ());
    }
}